

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmObjFixup::get_new_id(CVmObjFixup *this,vm_obj_id_t old_id)

{
  int iVar1;
  obj_fixup_entry *poVar2;
  vm_obj_id_t in_ESI;
  undefined8 in_RDI;
  vm_obj_id_t unaff_retaddr;
  CVmObjFixup *in_stack_00000008;
  obj_fixup_entry *entry;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CVmObjTable *in_stack_ffffffffffffffe0;
  vm_obj_id_t local_4;
  
  iVar1 = CVmObjTable::is_obj_id_valid
                    (in_stack_ffffffffffffffe0,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
  local_4 = in_ESI;
  if (((iVar1 == 0) ||
      (iVar1 = CVmObjTable::is_obj_in_root_set
                         ((CVmObjTable *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc), iVar1 == 0)) &&
     (poVar2 = find_entry(in_stack_00000008,unaff_retaddr), poVar2 != (obj_fixup_entry *)0x0)) {
    local_4 = poVar2->new_id;
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmObjFixup::get_new_id(VMG_ vm_obj_id_t old_id)
{
    /* 
     *   if it's a root-set object, don't bother even trying to translate
     *   it, because root-set objects have stable ID's that never change on
     *   saving or restoring 
     */
    if (G_obj_table->is_obj_id_valid(old_id)
        && G_obj_table->is_obj_in_root_set(old_id))
        return old_id;

    /* find the entry by the object ID */
    obj_fixup_entry *entry = find_entry(old_id);
    
    /* 
     *   if we found it, return the new ID; otherwise, return the old ID
     *   unchanged, since the ID evidently doesn't require mapping 
     */
    return (entry != 0 ? entry->new_id : old_id);
}